

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream,bool is_lazy)

{
  segment *psVar1;
  elfio *peVar2;
  pointer puVar3;
  section sVar4;
  istream *piVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong uVar12;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *psec;
  pointer puVar13;
  ulong uVar14;
  bool bVar15;
  ushort local_8e;
  byte local_8b;
  ushort local_8a;
  vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
  *local_88;
  segment_impl<ELFIO::Elf64_Phdr> *local_80;
  uint local_74;
  address_translator *local_70;
  endianness_convertor *local_68;
  elfio *local_60;
  istream *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_04;
  
  uVar6 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[4])()
  ;
  uVar7 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[9])()
  ;
  uVar8 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[0x1c]
          )();
  iVar9 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[0x1e]
          )();
  local_48 = CONCAT44(extraout_var,iVar9);
  local_8a = (ushort)uVar8;
  local_8b = (byte)uVar6;
  if ((((ushort)uVar7 < 0x38 && local_8b == 2) && local_8a != 0) ||
     (local_50 = (ulong)(uVar7 & 0xffff), ((ushort)uVar7 < 0x20 && local_8b == 1) && local_8a != 0))
  {
    bVar15 = false;
  }
  else {
    local_88 = (vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
                *)&this->segments_;
    local_68 = &this->convertor;
    local_70 = &this->addr_translator;
    local_8e = 0;
    local_74 = (uint)is_lazy;
    local_60 = this;
    local_58 = stream;
    while (piVar5 = local_58, peVar2 = local_60, bVar15 = (ushort)uVar8 <= local_8e, !bVar15) {
      if ((char)uVar6 == '\x02') {
        local_80 = (segment_impl<ELFIO::Elf64_Phdr> *)operator_new(0x90,(nothrow_t *)&std::nothrow);
        if (local_80 != (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
          (local_80->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_0010cb68;
          local_80->pstream = (istream *)0x0;
          (local_80->ph).p_type = 0;
          (local_80->ph).p_flags = 0;
          (local_80->ph).p_offset = 0;
          (local_80->ph).p_vaddr = 0;
          (local_80->ph).p_paddr = 0;
          (local_80->ph).p_filesz = 0;
          local_80->index = 0;
          (local_80->ph).p_memsz = 0;
          (local_80->ph).p_align = 0;
          (local_80->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
          (local_80->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_80->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_80->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_80->convertor = local_68;
          local_80->translator = local_70;
          local_80->stream_size = 0;
          *(undefined4 *)((long)&local_80->stream_size + 7) = 0;
        }
        std::
        vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
        ::emplace_back<ELFIO::segment_impl<ELFIO::Elf64_Phdr>*>(local_88,&local_80);
      }
      else {
        if ((char)uVar6 != '\x01') goto LAB_001066af;
        local_80 = (segment_impl<ELFIO::Elf64_Phdr> *)operator_new(0x78,(nothrow_t *)&std::nothrow);
        if (local_80 != (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
          (local_80->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_0010cc90;
          local_80->pstream = (istream *)0x0;
          (local_80->ph).p_type = 0;
          (local_80->ph).p_flags = 0;
          (local_80->ph).p_offset = 0;
          (local_80->ph).p_vaddr = 0;
          *(undefined8 *)((long)&(local_80->ph).p_vaddr + 2) = 0;
          *(undefined8 *)((long)&(local_80->ph).p_paddr + 2) = 0;
          (local_80->ph).p_memsz = 0;
          (local_80->ph).p_align = 0;
          *(undefined8 *)&local_80->index = 0;
          (local_80->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
          (local_80->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
          (local_80->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_70;
          (local_80->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined4 *)
           ((long)&(local_80->sections).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7) = 0;
        }
        std::
        vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
        ::emplace_back<ELFIO::segment_impl<ELFIO::Elf32_Phdr>*>
                  (local_88,(segment_impl<ELFIO::Elf32_Phdr> **)&local_80);
      }
      psVar1 = (peVar2->segments_).
               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
               super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
      iVar9 = (*psVar1->_vptr_segment[0x1c])
                        (psVar1,piVar5,local_8e * local_50 + local_48,0,(ulong)local_74);
      if (((char)iVar9 == '\0') ||
         (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0)) {
LAB_001066af:
        std::
        vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
        ::pop_back((vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                    *)local_88);
        return bVar15;
      }
      (*psVar1->_vptr_segment[0x1a])(psVar1,&local_8e);
      iVar9 = (*psVar1->_vptr_segment[0x11])(psVar1);
      iVar10 = (*psVar1->_vptr_segment[0xd])(psVar1);
      uVar14 = CONCAT44(extraout_var_01,iVar10) + CONCAT44(extraout_var_00,iVar9);
      local_38 = CONCAT44(extraout_var_00,iVar9);
      iVar9 = (*psVar1->_vptr_segment[9])(psVar1);
      iVar10 = (*psVar1->_vptr_segment[0xf])(psVar1);
      uVar12 = CONCAT44(extraout_var_03,iVar10) + CONCAT44(extraout_var_02,iVar9);
      peVar2 = (peVar2->sections).parent;
      puVar3 = (peVar2->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_40 = CONCAT44(extraout_var_02,iVar9);
      for (puVar13 = (peVar2->sections_).
                     super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar3;
          puVar13 = puVar13 + 1) {
        uVar6 = (*((puVar13->_M_t).
                   super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                   super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                   super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[7])()
        ;
        sVar4._vptr_section =
             ((puVar13->_M_t).
              super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
              super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
              super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section;
        if ((uVar6 & 2) == 0) {
          iVar9 = (*sVar4._vptr_section[0x17])();
          uVar11 = CONCAT44(extraout_var_04,iVar9);
          iVar9 = (*((puVar13->_M_t).
                     super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                     super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section
                    [0x13])();
          if (((uVar11 < uVar14) && (local_38 <= uVar11)) &&
             (CONCAT44(extraout_var_05,iVar9) + uVar11 <= uVar14)) {
LAB_0010662b:
            iVar9 = (*psVar1->_vptr_segment[3])(psVar1);
            if (((iVar9 != 7) ||
                (uVar6 = (*((puVar13->_M_t).
                            super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                            .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                           _vptr_section[7])(), (uVar6 >> 10 & 1) != 0)) &&
               ((uVar6 = (*((puVar13->_M_t).
                            super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                            .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                           _vptr_section[7])(), (uVar6 >> 10 & 1) == 0 ||
                (iVar9 = (*psVar1->_vptr_segment[3])(psVar1), iVar9 == 7)))) {
              uVar6 = (*((puVar13->_M_t).
                         super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                         .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                        _vptr_section[2])();
              (*psVar1->_vptr_segment[0x15])(psVar1,(ulong)(uVar6 & 0xffff),0);
            }
          }
        }
        else {
          iVar9 = (*sVar4._vptr_section[0x11])();
          uVar11 = CONCAT44(extraout_var_06,iVar9);
          iVar9 = (*((puVar13->_M_t).
                     super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                     super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section
                    [0x13])();
          if (((uVar11 < uVar12) && (local_40 <= uVar11)) &&
             (CONCAT44(extraout_var_07,iVar9) + uVar11 <= uVar12)) goto LAB_0010662b;
        }
      }
      local_8e = local_8e + 1;
      uVar6 = (uint)local_8b;
      uVar8 = (uint)local_8a;
    }
  }
  return bVar15;
}

Assistant:

bool load_segments( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_segment_entry_size();
        Elf_Half      num        = header->get_segments_num();
        Elf64_Off     offset     = header->get_segments_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Phdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Phdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            if ( file_class == ELFCLASS64 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf64_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else if ( file_class == ELFCLASS32 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf32_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else {
                segments_.pop_back();
                return false;
            }

            segment* seg = segments_.back().get();

            if ( !seg->load( stream,
                             static_cast<std::streamoff>( offset ) +
                                 static_cast<std::streampos>( i ) * entry_size,
                             is_lazy ) ||
                 stream.fail() ) {
                segments_.pop_back();
                return false;
            }

            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr  = seg->get_virtual_address();
            Elf64_Off segVEndAddr   = segVBaseAddr + seg->get_memory_size();
            for ( const auto& psec : sections ) {
                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if ( ( ( psec->get_flags() & SHF_ALLOC ) == SHF_ALLOC )
                         ? is_sect_in_seg( psec->get_address(),
                                           psec->get_size(), segVBaseAddr,
                                           segVEndAddr )
                         : is_sect_in_seg( psec->get_offset(), psec->get_size(),
                                           segBaseOffset, segEndOffset ) ) {

                    // If it is a TLS segment, add TLS sections only and vice versa
                    if ( ( ( seg->get_type() == PT_TLS ) &&
                           ( ( psec->get_flags() & SHF_TLS ) != SHF_TLS ) ) ||
                         ( ( ( psec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                           ( seg->get_type() != PT_TLS ) ) )
                        continue;

                    // Alignment of segment shall not be updated, to preserve original value
                    // It will be re-calculated on saving.
                    seg->add_section_index( psec->get_index(), 0 );
                }
            }
        }

        return true;
    }